

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

WebPEncodingError
EncodeImageNoHuffman
          (VP8LBitWriter *bw,uint32_t *argb,VP8LHashChain *hash_chain,VP8LBackwardRefs *refs_array,
          int width,int height,int quality,int low_effort)

{
  uint uVar1;
  VP8LBackwardRefs *refs;
  VP8LBitWriter *bw_00;
  int iVar2;
  WebPEncodingError WVar3;
  HuffmanTree *huff_tree;
  VP8LHistogramSet *set;
  long lVar4;
  HuffmanTreeToken *tokens;
  uint uVar5;
  HuffmanTreeCode *huffman_code;
  uint16_t histogram_symbols [1];
  int cache_bits;
  int local_bc;
  VP8LBackwardRefs *local_b8;
  VP8LBitWriter *local_b0;
  HuffmanTreeCode huffman_codes [5];
  
  huffman_codes[4].num_symbols = 0;
  huffman_codes[4]._4_4_ = 0;
  huffman_codes[4].code_lengths = (uint8_t *)0x0;
  huffman_codes[3].code_lengths = (uint8_t *)0x0;
  huffman_codes[3].codes = (uint16_t *)0x0;
  huffman_codes[2].codes = (uint16_t *)0x0;
  huffman_codes[3].num_symbols = 0;
  huffman_codes[3]._4_4_ = 0;
  huffman_codes[2].num_symbols = 0;
  huffman_codes[2]._4_4_ = 0;
  huffman_codes[2].code_lengths = (uint8_t *)0x0;
  huffman_codes[1].code_lengths = (uint8_t *)0x0;
  huffman_codes[1].codes = (uint16_t *)0x0;
  huffman_codes[0].codes = (uint16_t *)0x0;
  huffman_codes[1].num_symbols = 0;
  huffman_codes[1]._4_4_ = 0;
  huffman_codes[0].num_symbols = 0;
  huffman_codes[0]._4_4_ = 0;
  huffman_codes[0].code_lengths = (uint8_t *)0x0;
  huffman_codes[4].codes = (uint16_t *)0x0;
  histogram_symbols[0] = 0;
  cache_bits = 0;
  huff_tree = (HuffmanTree *)WebPSafeMalloc(0x39,0x10);
  if ((huff_tree == (HuffmanTree *)0x0) ||
     (local_b8 = refs_array, local_b0 = bw,
     iVar2 = VP8LHashChainFill(hash_chain,quality,argb,width,height,low_effort), refs = local_b8,
     iVar2 == 0)) {
    tokens = (HuffmanTreeToken *)0x0;
    set = (VP8LHistogramSet *)0x0;
    WVar3 = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  else {
    WVar3 = VP8LGetBackwardReferences
                      (width,height,argb,quality,0,3,0,0,hash_chain,local_b8,&cache_bits);
    if (WVar3 == VP8_ENC_OK) {
      WVar3 = VP8_ENC_ERROR_OUT_OF_MEMORY;
      local_bc = width;
      set = VP8LAllocateHistogramSet(1,cache_bits);
      if (set != (VP8LHistogramSet *)0x0) {
        VP8LHistogramSetClear(set);
        VP8LHistogramStoreRefs(refs,*set->histograms);
        iVar2 = GetHuffBitLengthsAndCodes(set,huffman_codes);
        bw_00 = local_b0;
        if (iVar2 != 0) {
          iVar2 = local_b0->used_;
          if (0x1f < iVar2) {
            VP8LPutBitsFlushBits(local_b0);
            iVar2 = bw_00->used_;
          }
          bw_00->used_ = iVar2 + 1;
          lVar4 = 0;
          uVar5 = 0;
          do {
            uVar1 = *(uint *)((long)&huffman_codes[0].num_symbols + lVar4);
            if ((int)uVar1 < (int)uVar5) {
              uVar1 = uVar5;
            }
            uVar5 = uVar1;
            lVar4 = lVar4 + 0x18;
          } while (lVar4 != 0x78);
          tokens = (HuffmanTreeToken *)WebPSafeMalloc((ulong)uVar5,2);
          if (tokens != (HuffmanTreeToken *)0x0) {
            lVar4 = 0;
            do {
              huffman_code = (HuffmanTreeCode *)((long)&huffman_codes[0].num_symbols + lVar4);
              StoreHuffmanCode(bw_00,huff_tree,tokens,huffman_code);
              ClearHuffmanTreeIfOnlyOneSymbol(huffman_code);
              lVar4 = lVar4 + 0x18;
            } while (lVar4 != 0x78);
            WVar3 = StoreImageToBitMask(bw_00,local_bc,0,local_b8,histogram_symbols,huffman_codes);
            goto LAB_00137cb9;
          }
        }
        tokens = (HuffmanTreeToken *)0x0;
        goto LAB_00137cb9;
      }
    }
    tokens = (HuffmanTreeToken *)0x0;
    set = (VP8LHistogramSet *)0x0;
  }
LAB_00137cb9:
  WebPSafeFree(tokens);
  WebPSafeFree(huff_tree);
  VP8LFreeHistogramSet(set);
  WebPSafeFree(huffman_codes[0].codes);
  return WVar3;
}

Assistant:

static WebPEncodingError EncodeImageNoHuffman(
    VP8LBitWriter* const bw, const uint32_t* const argb,
    VP8LHashChain* const hash_chain, VP8LBackwardRefs* const refs_array,
    int width, int height, int quality, int low_effort) {
  int i;
  int max_tokens = 0;
  WebPEncodingError err = VP8_ENC_OK;
  VP8LBackwardRefs* refs;
  HuffmanTreeToken* tokens = NULL;
  HuffmanTreeCode huffman_codes[5] = { { 0, NULL, NULL } };
  const uint16_t histogram_symbols[1] = { 0 };    // only one tree, one symbol
  int cache_bits = 0;
  VP8LHistogramSet* histogram_image = NULL;
  HuffmanTree* const huff_tree = (HuffmanTree*)WebPSafeMalloc(
        3ULL * CODE_LENGTH_CODES, sizeof(*huff_tree));
  if (huff_tree == NULL) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  // Calculate backward references from ARGB image.
  if (!VP8LHashChainFill(hash_chain, quality, argb, width, height,
                         low_effort)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }
  err = VP8LGetBackwardReferences(
      width, height, argb, quality, /*low_effort=*/0, kLZ77Standard | kLZ77RLE,
      cache_bits, /*do_no_cache=*/0, hash_chain, refs_array, &cache_bits);
  if (err != VP8_ENC_OK) goto Error;
  refs = &refs_array[0];
  histogram_image = VP8LAllocateHistogramSet(1, cache_bits);
  if (histogram_image == NULL) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }
  VP8LHistogramSetClear(histogram_image);

  // Build histogram image and symbols from backward references.
  VP8LHistogramStoreRefs(refs, histogram_image->histograms[0]);

  // Create Huffman bit lengths and codes for each histogram image.
  assert(histogram_image->size == 1);
  if (!GetHuffBitLengthsAndCodes(histogram_image, huffman_codes)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  // No color cache, no Huffman image.
  VP8LPutBits(bw, 0, 1);

  // Find maximum number of symbols for the huffman tree-set.
  for (i = 0; i < 5; ++i) {
    HuffmanTreeCode* const codes = &huffman_codes[i];
    if (max_tokens < codes->num_symbols) {
      max_tokens = codes->num_symbols;
    }
  }

  tokens = (HuffmanTreeToken*)WebPSafeMalloc(max_tokens, sizeof(*tokens));
  if (tokens == NULL) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  // Store Huffman codes.
  for (i = 0; i < 5; ++i) {
    HuffmanTreeCode* const codes = &huffman_codes[i];
    StoreHuffmanCode(bw, huff_tree, tokens, codes);
    ClearHuffmanTreeIfOnlyOneSymbol(codes);
  }

  // Store actual literals.
  err = StoreImageToBitMask(bw, width, 0, refs, histogram_symbols,
                            huffman_codes);

 Error:
  WebPSafeFree(tokens);
  WebPSafeFree(huff_tree);
  VP8LFreeHistogramSet(histogram_image);
  WebPSafeFree(huffman_codes[0].codes);
  return err;
}